

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
::value_init<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>*>
          (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
           *this,field_type i,allocator_type *alloc,
          unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> **args)

{
  unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *puVar1;
  template_ElementType<3UL> *ptVar2;
  undefined7 in_register_00000031;
  
  GetField<3ul>(this);
  ptVar2 = GetField<3ul>(this);
  puVar1 = *args;
  ptVar2[CONCAT71(in_register_00000031,i) & 0xffffffff]._M_t.
  super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
  super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
  super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl =
       (puVar1->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
       super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
       super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl;
  (puVar1->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
  super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
  super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl = (SeqEntry *)0x0;
  return;
}

Assistant:

void value_init(const field_type i, allocator_type *alloc, Args &&... args) {
    next_generation();
    absl::container_internal::SanitizerUnpoisonObject(slot(i));
    params_type::construct(alloc, slot(i), std::forward<Args>(args)...);
  }